

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

bool __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::iterator::operator!=(iterator *this,iterator *other)

{
  bool bVar1;
  iterator local_b0;
  
  iterator(&local_b0,other);
  bVar1 = this->valid;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  ::~GroupByState(&local_b0.source);
  return (bool)((local_b0.valid | bVar1) & 1);
}

Assistant:

bool operator!=(iterator other) const { return !(*this == other); }